

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm_all.cc
# Opt level: O1

void __thiscall
cnn::TreeLSTMAllBuilder::start_new_sequence_impl
          (TreeLSTMAllBuilder *this,
          vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *hinit)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear(&this->h);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear(&this->c);
  lVar5 = (long)(hinit->
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(hinit->
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar5 == 0) {
    bVar4 = false;
  }
  else {
    if (lVar5 >> 4 != (ulong)(this->layers * 2)) {
      __assert_fail("layers*2 == hinit.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/treelstm_all.cc"
                    ,0x7c,
                    "virtual void cnn::TreeLSTMAllBuilder::start_new_sequence_impl(const vector<Expression> &)"
                   );
    }
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (&this->h0,(ulong)this->layers);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (&this->c0,(ulong)this->layers);
    uVar7 = this->layers;
    uVar6 = (ulong)uVar7;
    bVar4 = true;
    if (uVar6 != 0) {
      pEVar1 = (hinit->
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pEVar2 = (this->c0).
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar3 = (this->h0).
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = 0;
      do {
        *(undefined8 *)((long)&pEVar2->pg + lVar5) = *(undefined8 *)((long)&pEVar1->pg + lVar5);
        *(undefined4 *)((long)&(pEVar2->i).t + lVar5) =
             *(undefined4 *)((long)&(pEVar1->i).t + lVar5);
        *(ComputationGraph **)((long)&pEVar3->pg + lVar5) = pEVar1[uVar7].pg;
        *(uint *)((long)&(pEVar3->i).t + lVar5) = pEVar1[uVar7].i.t;
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x10;
      } while (uVar6 << 4 != lVar5);
    }
  }
  this->has_initial_state = bVar4;
  return;
}

Assistant:

void TreeLSTMAllBuilder::start_new_sequence_impl(const vector<Expression>& hinit) {
  h.clear();
  c.clear();
  if (hinit.size() > 0) {
    assert(layers*2 == hinit.size());
    h0.resize(layers);
    c0.resize(layers);
    for (unsigned i = 0; i < layers; ++i) {
      c0[i] = hinit[i];
      h0[i] = hinit[i + layers];
    }
    has_initial_state = true;
  } else {
    has_initial_state = false;
  }
}